

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

UBool icu_63::isDataLoaded(UErrorCode *pErrorCode)

{
  UBool UVar1;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (gCharNamesInitOnce != 2) {
      UVar1 = umtx_initImplPreInit((UInitOnce *)&gCharNamesInitOnce);
      if (UVar1 != '\0') {
        uCharNamesData =
             udata_openChoice_63((char *)0x0,"icu","unames",isAcceptable,(void *)0x0,pErrorCode);
        if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          uCharNames = udata_getMemory_63(uCharNamesData);
        }
        else {
          uCharNamesData = (UDataMemory *)0x0;
        }
        ucln_common_registerCleanup_63(UCLN_COMMON_UNAMES,unames_cleanup);
        DAT_00256de4 = *pErrorCode;
        umtx_initImplPostInit((UInitOnce *)&gCharNamesInitOnce);
        goto LAB_001c2d55;
      }
    }
    if (U_ZERO_ERROR < DAT_00256de4) {
      *pErrorCode = DAT_00256de4;
    }
  }
LAB_001c2d55:
  return *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

static UBool
isDataLoaded(UErrorCode *pErrorCode) {
    umtx_initOnce(gCharNamesInitOnce, &loadCharNames, *pErrorCode);
    return U_SUCCESS(*pErrorCode);
}